

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

int lj_opt_fwd_tptr(jit_State *J,IRRef lim)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  AliasRet AVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = (J->fold).ins.field_0.op1;
  uVar5 = (uint)J->chain[0x3b];
  do {
    if (uVar5 <= lim) {
      return 1;
    }
    pIVar3 = (J->cur).ir;
    uVar2 = pIVar3[uVar5].field_0.op1;
    if (uVar1 == uVar2) {
      bVar6 = false;
    }
    else {
      AVar4 = aa_table(J,(uint)uVar1,(uint)uVar2);
      bVar6 = AVar4 == ALIAS_NO;
      if (bVar6) {
        uVar5 = (uint)*(ushort *)((long)pIVar3 + (ulong)uVar5 * 8 + 6);
      }
    }
  } while (bVar6);
  return 0;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_tptr(jit_State *J, IRRef lim)
{
  IRRef ta = fins->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > lim) {
    IRIns *newref = IR(ref);
    if (ta == newref->op1 || aa_table(J, ta, newref->op1) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = newref->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}